

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_>
wabt::MakeUnique<wabt::BrTableExpr>(void)

{
  BrTableExpr *this;
  __uniq_ptr_data<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>,_true,_true> in_RDI;
  Location LStack_38;
  
  this = (BrTableExpr *)operator_new(0xa0);
  LStack_38.field_1.field_0.line = 0;
  LStack_38.field_1._4_8_ = 0;
  LStack_38.filename.data_ = (char *)0x0;
  LStack_38.filename.size_._0_4_ = 0;
  LStack_38.filename.size_._4_4_ = 0;
  BrTableExpr::BrTableExpr(this,&LStack_38);
  *(BrTableExpr **)
   in_RDI.super___uniq_ptr_impl<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_>._M_t.
   super__Tuple_impl<0UL,_wabt::BrTableExpr_*,_std::default_delete<wabt::BrTableExpr>_>.
   super__Head_base<0UL,_wabt::BrTableExpr_*,_false>._M_head_impl = this;
  return (__uniq_ptr_data<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>,_true,_true>)
         (tuple<wabt::BrTableExpr_*,_std::default_delete<wabt::BrTableExpr>_>)
         in_RDI.super___uniq_ptr_impl<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_>.
         _M_t.super__Tuple_impl<0UL,_wabt::BrTableExpr_*,_std::default_delete<wabt::BrTableExpr>_>.
         super__Head_base<0UL,_wabt::BrTableExpr_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}